

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector2.h
# Opt level: O0

ostream * RVO::operator<<(ostream *os,Vector2 *vector)

{
  ostream *poVar1;
  float fVar2;
  Vector2 *vector_local;
  ostream *os_local;
  
  poVar1 = std::operator<<(os,"(");
  fVar2 = Vector2::x(vector);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,fVar2);
  poVar1 = std::operator<<(poVar1,",");
  fVar2 = Vector2::y(vector);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,fVar2);
  std::operator<<(poVar1,")");
  return os;
}

Assistant:

inline std::ostream &operator<<(std::ostream &os, const Vector2 &vector)
	{
		os << "(" << vector.x() << "," << vector.y() << ")";

		return os;
	}